

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

AttributeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Symbol *args_2,ExpressionSyntax *args_3)

{
  string_view name;
  AttributeSymbol *pAVar1;
  Symbol *in_RCX;
  AttributeSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  BumpAllocator *in_R8;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pAVar1 = (AttributeSymbol *)allocate(in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::AttributeSymbol::AttributeSymbol(in_RDX,name,in_RSI,in_RCX,(ExpressionSyntax *)in_R8);
  return pAVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }